

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

void clearBits(quint8 *where,int start,int end)

{
  int iVar1;
  int iVar2;
  
  if (start == 0x80) {
    return;
  }
  iVar1 = start + 7;
  iVar2 = start;
  if (start < 0) {
    iVar2 = iVar1;
  }
  where[iVar2 >> 3] = where[iVar2 >> 3] & (byte)(-1 << (8 - ((byte)start & 7) & 0x1f));
  iVar2 = start + 0xe;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  memset(where + (iVar2 >> 3),0,(long)(0x10 - (iVar2 >> 3)));
  return;
}

Assistant:

static void clearBits(quint8 *where, int start, int end)
{
    Q_ASSERT(end == 32 || end == 128);
    if (start == end)
        return;

    // for the byte where 'start' is, clear the lower bits only
    quint8 bytemask = 256 - (1 << (8 - (start & 7)));
    where[start / 8] &= bytemask;

    // for the tail part, clear everything
    memset(where + (start + 7) / 8, 0, end / 8 - (start + 7) / 8);
}